

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attribute-eval-typed-animatable.cc
# Opt level: O0

bool tinyusdz::tydra::EvaluateTypedAnimatableAttribute<tinyusdz::value::color4f>
               (Stage *stage,TypedAttribute<tinyusdz::Animatable<tinyusdz::value::color4f>_> *tattr,
               string *attr_name,color4f *value_out,string *err,double t,
               TimeSampleInterpolationType tinterp)

{
  float fVar1;
  bool bVar2;
  ostream *poVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2;
  allocator local_839;
  string local_838 [32];
  fmt local_818 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7f8;
  string local_7d8;
  allocator local_7b1;
  string local_7b0 [32];
  string local_790;
  color4f *local_770;
  color4f *pv;
  undefined1 local_760 [7];
  bool ret;
  TerminalAttributeValue value_1;
  Attribute attr;
  string local_260 [32];
  fmt local_240 [36];
  int local_21c;
  undefined1 local_218 [8];
  Animatable<tinyusdz::value::color4f> value;
  ostringstream local_1c0 [8];
  ostringstream ss_e;
  TimeSampleInterpolationType tinterp_local;
  double t_local;
  string *err_local;
  color4f *value_out_local;
  string *attr_name_local;
  TypedAttribute<tinyusdz::Animatable<tinyusdz::value::color4f>_> *tattr_local;
  Stage *stage_local;
  
  if (value_out == (color4f *)0x0) {
    ::std::__cxx11::ostringstream::ostringstream(local_1c0);
    poVar3 = ::std::operator<<((ostream *)local_1c0,"[error]");
    poVar3 = ::std::operator<<(poVar3,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/attribute-eval-typed-animatable.cc"
                              );
    poVar3 = ::std::operator<<(poVar3,":");
    poVar3 = ::std::operator<<(poVar3,"EvaluateTypedAnimatableAttribute");
    poVar3 = ::std::operator<<(poVar3,"():");
    poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0xd4);
    ::std::operator<<(poVar3," ");
    poVar3 = ::std::operator<<((ostream *)local_1c0,"`value_out` param is nullptr.");
    ::std::operator<<(poVar3,"\n");
    if (err != (string *)0x0) {
      ::std::__cxx11::ostringstream::str();
      ::std::__cxx11::string::operator+=((string *)err,(string *)&value._ts._dirty);
      ::std::__cxx11::string::~string((string *)&value._ts._dirty);
    }
    stage_local._7_1_ = 0;
    ::std::__cxx11::ostringstream::~ostringstream(local_1c0);
    goto LAB_0086b793;
  }
  bVar2 = TypedAttribute<tinyusdz::Animatable<tinyusdz::value::color4f>_>::is_blocked(tattr);
  if (bVar2) {
    if (err != (string *)0x0) {
      ::std::__cxx11::string::operator+=((string *)err,"Attribute is Blocked.\n");
    }
    stage_local._7_1_ = 0;
    goto LAB_0086b793;
  }
  bVar2 = TypedAttribute<tinyusdz::Animatable<tinyusdz::value::color4f>_>::has_value(tattr);
  if (bVar2) {
    Animatable<tinyusdz::value::color4f>::Animatable
              ((Animatable<tinyusdz::value::color4f> *)local_218);
    bVar2 = TypedAttribute<tinyusdz::Animatable<tinyusdz::value::color4f>_>::get_value
                      (tattr,(Animatable<tinyusdz::value::color4f> *)local_218);
    if (bVar2) {
      bVar2 = Animatable<tinyusdz::value::color4f>::get
                        ((Animatable<tinyusdz::value::color4f> *)local_218,t,value_out,tinterp);
      if (bVar2) {
        stage_local._7_1_ = 1;
        local_21c = 1;
      }
      else {
        if (err != (string *)0x0) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    (local_260,"Failed to get TypedAnimatableAttribute value: {} \n",
                     (allocator *)
                     ((long)&attr._metas.stringData.
                             super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
          fmt::format<std::__cxx11::string>
                    (local_240,(string *)local_260,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)attr_name)
          ;
          ::std::__cxx11::string::operator+=((string *)err,(string *)local_240);
          ::std::__cxx11::string::~string((string *)local_240);
          ::std::__cxx11::string::~string(local_260);
          ::std::allocator<char>::~allocator
                    ((allocator<char> *)
                     ((long)&attr._metas.stringData.
                             super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        }
        stage_local._7_1_ = 0;
        local_21c = 1;
      }
    }
    else {
      local_21c = 0;
    }
    Animatable<tinyusdz::value::color4f>::~Animatable
              ((Animatable<tinyusdz::value::color4f> *)local_218);
joined_r0x0086b516:
    if (local_21c != 0) goto LAB_0086b793;
  }
  else {
    bVar2 = TypedAttribute<tinyusdz::Animatable<tinyusdz::value::color4f>_>::has_connections(tattr);
    if (bVar2) {
      anon_unknown_2::ToAttributeConnection<tinyusdz::value::color4f>
                ((Attribute *)
                 &value_1._meta.stringData.
                  super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,tattr);
      TerminalAttributeValue::TerminalAttributeValue((TerminalAttributeValue *)local_760);
      args_2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)tinterp;
      pv._7_1_ = EvaluateAttribute(stage,(Attribute *)
                                         &value_1._meta.stringData.
                                          super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                   attr_name,(TerminalAttributeValue *)local_760,err,t,tinterp);
      if ((bool)pv._7_1_) {
        local_770 = TerminalAttributeValue::as<tinyusdz::value::color4f>
                              ((TerminalAttributeValue *)local_760);
        if (local_770 == (color4f *)0x0) {
          if (err != (string *)0x0) {
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      (local_7b0,
                       "Type mismatch. Value producing attribute has type {}, but requested type is {}[]. Attribute: {}"
                       ,&local_7b1);
            TerminalAttributeValue::type_name_abi_cxx11_
                      (&local_7d8,(TerminalAttributeValue *)local_760);
            tinyusdz::value::TypeTraits<tinyusdz::value::color4f>::type_name_abi_cxx11_();
            fmt::format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                      (&local_790,(fmt *)local_7b0,&local_7d8,&local_7f8,attr_name,args_2);
            ::std::__cxx11::string::operator+=((string *)err,(string *)&local_790);
            ::std::__cxx11::string::~string((string *)&local_790);
            ::std::__cxx11::string::~string((string *)&local_7f8);
            ::std::__cxx11::string::~string((string *)&local_7d8);
            ::std::__cxx11::string::~string(local_7b0);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_7b1);
          }
          local_21c = 0;
        }
        else {
          fVar1 = local_770->g;
          value_out->r = local_770->r;
          value_out->g = fVar1;
          fVar1 = local_770->a;
          value_out->b = local_770->b;
          value_out->a = fVar1;
          stage_local._7_1_ = 1;
          local_21c = 1;
        }
      }
      else {
        stage_local._7_1_ = 0;
        local_21c = 1;
      }
      TerminalAttributeValue::~TerminalAttributeValue((TerminalAttributeValue *)local_760);
      Attribute::~Attribute
                ((Attribute *)
                 &value_1._meta.stringData.
                  super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      goto joined_r0x0086b516;
    }
    bVar2 = TypedAttribute<tinyusdz::Animatable<tinyusdz::value::color4f>_>::is_value_empty(tattr);
    if (bVar2) {
      if (err != (string *)0x0) {
        ::std::__cxx11::string::operator+=((string *)err,"Attribute value is empty.\n");
      }
      stage_local._7_1_ = 0;
      goto LAB_0086b793;
    }
    if (err != (string *)0x0) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_838,"[Internal error] Invalid TypedAttribute? : {} \n",&local_839);
      fmt::format<std::__cxx11::string>
                (local_818,(string *)local_838,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)attr_name);
      ::std::__cxx11::string::operator+=((string *)err,(string *)local_818);
      ::std::__cxx11::string::~string((string *)local_818);
      ::std::__cxx11::string::~string(local_838);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_839);
    }
  }
  stage_local._7_1_ = 0;
LAB_0086b793:
  return (bool)(stage_local._7_1_ & 1);
}

Assistant:

bool EvaluateTypedAnimatableAttribute(
    const tinyusdz::Stage &stage, const TypedAttribute<Animatable<T>> &tattr,
    const std::string &attr_name,
    T *value_out,
    std::string *err,
    const double t,
    const value::TimeSampleInterpolationType tinterp) {

  if (!value_out) {
    PUSH_ERROR_AND_RETURN("`value_out` param is nullptr.");
  }

  // Eval order:
  // - ValueBlocked?
  // - has value?(default value or timesamped value)
  // - has connection?

  if (tattr.is_blocked()) {
    if (err) {
      (*err) += "Attribute is Blocked.\n";
    }
    return false;
  } else if (tattr.has_value()) {
    Animatable<T> value;
    if (tattr.get_value(&value)) {
      if (value.get(t, value_out, tinterp)) {
        return true;
      } else {
        if (err) {
          (*err) += fmt::format("Failed to get TypedAnimatableAttribute value: {} \n", attr_name);
        }
        return false;
      }
    }
  } else if (tattr.has_connections()) {

    // Follow targetPath
    Attribute attr = ToAttributeConnection(tattr);

    TerminalAttributeValue value;
    bool ret = EvaluateAttribute(stage, attr, attr_name, &value, err,
                                 t, tinterp);

    if (!ret) {
      return false;
    }

    if (auto pv = value.as<T>()) {
      (*value_out) = *pv;
      return true;
    }

    if (err) {
      (*err) += fmt::format("Type mismatch. Value producing attribute has type {}, but requested type is {}[]. Attribute: {}", value.type_name(), value::TypeTraits<T>::type_name(), attr_name);
    }

  } else if (tattr.is_value_empty()) {
    if (err) {
      (*err) += "Attribute value is empty.\n";
    }
    return false;
  } else {
    if (err) {
      (*err) += fmt::format("[Internal error] Invalid TypedAttribute? : {} \n", attr_name);
    }
  }
  return false;
}